

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O0

int bitmap_iterator_next(bitmap_iterator_t *iter,size_t *nbit)

{
  size_t sVar1;
  bitmap_el_t *pbVar2;
  bitmap_el_t *addr;
  bitmap_el_t el;
  size_t len;
  size_t curr_nel;
  size_t el_bits_num;
  size_t *nbit_local;
  bitmap_iterator_t *iter_local;
  
  len = iter->nbit >> 6;
  sVar1 = VARR_bitmap_el_tlength(iter->bitmap);
  pbVar2 = VARR_bitmap_el_taddr(iter->bitmap);
  do {
    if (sVar1 <= len) {
      return 0;
    }
    if (pbVar2[len] != 0) {
      addr = (bitmap_el_t *)(pbVar2[len] >> ((byte)iter->nbit & 0x3f));
      while (addr != (bitmap_el_t *)0x0) {
        if (((ulong)addr & 1) != 0) {
          sVar1 = iter->nbit;
          iter->nbit = sVar1 + 1;
          *nbit = sVar1;
          return 1;
        }
        addr = (bitmap_el_t *)((ulong)addr >> 1);
        iter->nbit = iter->nbit + 1;
      }
    }
    len = len + 1;
    iter->nbit = len * 0x40;
  } while( true );
}

Assistant:

static inline int bitmap_iterator_next (bitmap_iterator_t *iter, size_t *nbit) {
  const size_t el_bits_num = sizeof (bitmap_el_t) * CHAR_BIT;
  size_t curr_nel = iter->nbit / el_bits_num, len = VARR_LENGTH (bitmap_el_t, iter->bitmap);
  bitmap_el_t el, *addr = VARR_ADDR (bitmap_el_t, iter->bitmap);

  for (; curr_nel < len; curr_nel++, iter->nbit = curr_nel * el_bits_num)
    if ((el = addr[curr_nel]) != 0)
      for (el >>= iter->nbit % el_bits_num; el != 0; el >>= 1, iter->nbit++)
        if (el & 1) {
          *nbit = iter->nbit++;
          return TRUE;
        }
  return FALSE;
}